

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O0

void testing::internal::UniversalTersePrinter<const_char_*>::Print(char *str,ostream *os)

{
  ostream *in_RSI;
  ostream *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value;
  undefined1 local_31 [49];
  
  if (in_RDI == (ostream *)0x0) {
    std::operator<<(in_RSI,"NULL");
  }
  else {
    value = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_31;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)(local_31 + 1),(char *)in_RDI,(allocator *)value);
    UniversalPrint<std::__cxx11::string>(value,in_RDI);
    std::__cxx11::string::~string((string *)(local_31 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_31);
  }
  return;
}

Assistant:

static void Print(const char* str, ::std::ostream* os) {
    if (str == nullptr) {
      *os << "NULL";
    } else {
      UniversalPrint(std::string(str), os);
    }
  }